

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O2

void __thiscall
glslang::TIntermSymbol::TIntermSymbol
          (TIntermSymbol *this,longlong i,TString *n,EShLanguage s,TType *t,TString *mn)

{
  TIntermTyped::TIntermTyped(&this->super_TIntermTyped,t);
  (this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_00a61860;
  this->id = i;
  this->flattenSubset = -1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->name);
  this->stage = s;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->mangledName);
  (this->constArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00a5b8a8;
  (this->constArray).unionArray = (TConstUnionVector *)0x0;
  this->constSubtree = (TIntermTyped *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->name,n);
  if (mn == (TString *)0x0) {
    mn = n;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->mangledName,mn);
  return;
}

Assistant:

TIntermSymbol(long long i, const TString& n, EShLanguage s, const TType& t, const TString* mn = nullptr)
        : TIntermTyped(t), id(i), flattenSubset(-1), stage(s), constSubtree(nullptr) { 
        name = n;
        if (mn) {
            mangledName = *mn;
        } else {
            mangledName = n;
        }
    }